

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_wait(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_ppc64(tcg_ctx,1);
  tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_st_i32,(TCGArg)(pTVar1 + (long)tcg_ctx),
                    (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0xffffffffffffe3d8);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  gen_exception_nip(ctx,0x10001,(ctx->base).pc_next);
  return;
}

Assistant:

static void gen_wait(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, 1);
#ifdef _MSC_VER
    tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env,
                   0 - offsetof(PowerPCCPU, env) + offsetof(CPUState, halted));
#else
    tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env,
                   -offsetof(PowerPCCPU, env) + offsetof(CPUState, halted));
#endif
    tcg_temp_free_i32(tcg_ctx, t0);
    /* Stop translation, as the CPU is supposed to sleep from now */
    gen_exception_nip(ctx, EXCP_HLT, ctx->base.pc_next);
}